

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int walCheckpoint(Wal *pWal,sqlite3 *db,int eMode,_func_int_void_ptr *xBusy,void *pBusyArg,
                 int sync_flags,u8 *zBuf)

{
  uint uVar1;
  int iVar2;
  WalIndexHdr *pWVar3;
  bool bVar4;
  u32 local_98;
  u32 local_94;
  long lStack_90;
  u32 salt1;
  i64 szDb;
  i64 iOffset;
  i64 nSize;
  i64 nReq;
  u32 nBackfill;
  u32 y;
  WalCkptInfo *pInfo;
  uint local_58;
  int i;
  u32 mxPage;
  u32 mxSafeFrame;
  u32 iFrame;
  u32 iDbpage;
  WalIterator *pIter;
  int local_38;
  int szPage;
  int rc;
  int sync_flags_local;
  void *pBusyArg_local;
  _func_int_void_ptr *xBusy_local;
  sqlite3 *psStack_18;
  int eMode_local;
  sqlite3 *db_local;
  Wal *pWal_local;
  
  local_38 = 0;
  _iFrame = (WalIterator *)0x0;
  mxSafeFrame = 0;
  mxPage = 0;
  szPage = sync_flags;
  _rc = pBusyArg;
  pBusyArg_local = xBusy;
  xBusy_local._4_4_ = eMode;
  psStack_18 = db;
  db_local = (sqlite3 *)pWal;
  pIter._4_4_ = walPagesize(pWal);
  _nBackfill = walCkptInfo((Wal *)db_local);
  if (_nBackfill->nBackfill < (uint)db_local->iSysErrno) {
    i = db_local->iSysErrno;
    local_58._0_2_ = db_local->dbOptFlags;
    local_58._2_1_ = db_local->enc;
    local_58._3_1_ = db_local->autoCommit;
    for (pInfo._4_4_ = 1; pInfo._4_4_ < 5; pInfo._4_4_ = pInfo._4_4_ + 1) {
      nReq._4_4_ = _nBackfill->aReadMark[pInfo._4_4_];
      if (nReq._4_4_ < (uint)i) {
        local_38 = walBusyLock((Wal *)db_local,(_func_int_void_ptr *)pBusyArg_local,_rc,
                               pInfo._4_4_ + 3,1);
        if (local_38 == 0) {
          if (pInfo._4_4_ == 1) {
            local_98 = i;
          }
          else {
            local_98 = 0xffffffff;
          }
          _nBackfill->aReadMark[pInfo._4_4_] = local_98;
          walUnlockExclusive((Wal *)db_local,pInfo._4_4_ + 3,1);
        }
        else {
          if (local_38 != 5) goto LAB_00168b8a;
          i = nReq._4_4_;
          pBusyArg_local = (void *)0x0;
        }
      }
    }
    if (_nBackfill->nBackfill < (uint)i) {
      local_38 = walIteratorInit((Wal *)db_local,_nBackfill->nBackfill,(WalIterator **)&iFrame);
    }
    if ((_iFrame != (WalIterator *)0x0) &&
       (local_38 = walBusyLock((Wal *)db_local,(_func_int_void_ptr *)pBusyArg_local,_rc,3,1),
       local_38 == 0)) {
      nReq._0_4_ = _nBackfill->nBackfill;
      _nBackfill->nBackfillAttempted = i;
      local_38 = sqlite3OsSync((sqlite3_file *)db_local->pDfltColl,szPage >> 2 & 3);
      if (local_38 == 0) {
        nSize = (ulong)local_58 * (long)pIter._4_4_;
        local_38 = sqlite3OsFileSize((sqlite3_file *)db_local->pVdbe,&iOffset);
        if ((local_38 == 0) && (iOffset < nSize)) {
          sqlite3OsFileControlHint((sqlite3_file *)db_local->pVdbe,5,&nSize);
        }
      }
      do {
        do {
          bVar4 = false;
          if (local_38 == 0) {
            iVar2 = walIteratorNext(_iFrame,&mxSafeFrame,&mxPage);
            bVar4 = iVar2 == 0;
          }
          if (!bVar4) goto LAB_00168a36;
          if ((psStack_18->u1).isInterrupted != 0) {
            local_38 = 9;
            if (psStack_18->mallocFailed != '\0') {
              local_38 = 7;
            }
            goto LAB_00168a36;
          }
        } while (((mxPage <= (u32)nReq) || ((uint)i < mxPage)) || (local_58 < mxSafeFrame));
        szDb = (ulong)(mxPage - 1) * (long)(pIter._4_4_ + 0x18) + 0x38;
        local_38 = sqlite3OsRead((sqlite3_file *)db_local->pDfltColl,zBuf,pIter._4_4_,szDb);
        if (local_38 != 0) break;
        szDb = (ulong)(mxSafeFrame - 1) * (long)pIter._4_4_;
        local_38 = sqlite3OsWrite((sqlite3_file *)db_local->pVdbe,zBuf,pIter._4_4_,szDb);
      } while (local_38 == 0);
LAB_00168a36:
      iVar2 = i;
      if (local_38 == 0) {
        pWVar3 = walIndexHdr((Wal *)db_local);
        if (iVar2 == pWVar3->mxFrame) {
          uVar1._0_2_ = db_local->dbOptFlags;
          uVar1._2_1_ = db_local->enc;
          uVar1._3_1_ = db_local->autoCommit;
          lStack_90 = (ulong)uVar1 * (long)pIter._4_4_;
          local_38 = sqlite3OsTruncate((sqlite3_file *)db_local->pVdbe,lStack_90);
          if (local_38 == 0) {
            local_38 = sqlite3OsSync((sqlite3_file *)db_local->pVdbe,szPage >> 2 & 3);
          }
        }
        if (local_38 == 0) {
          _nBackfill->nBackfill = i;
        }
      }
      walUnlockExclusive((Wal *)db_local,3,1);
    }
    if (local_38 == 5) {
      local_38 = 0;
    }
  }
  if ((local_38 == 0) && (xBusy_local._4_4_ != 0)) {
    if (_nBackfill->nBackfill < (uint)db_local->iSysErrno) {
      local_38 = 5;
    }
    else if (1 < xBusy_local._4_4_) {
      sqlite3_randomness(4,&local_94);
      local_38 = walBusyLock((Wal *)db_local,(_func_int_void_ptr *)pBusyArg_local,_rc,4,4);
      if (local_38 == 0) {
        if (xBusy_local._4_4_ == 3) {
          walRestartHdr((Wal *)db_local,local_94);
          local_38 = sqlite3OsTruncate((sqlite3_file *)db_local->pDfltColl,0);
        }
        walUnlockExclusive((Wal *)db_local,4,4);
      }
    }
  }
LAB_00168b8a:
  walIteratorFree(_iFrame);
  return local_38;
}

Assistant:

static int walCheckpoint(
  Wal *pWal,                      /* Wal connection */
  sqlite3 *db,                    /* Check for interrupts on this handle */
  int eMode,                      /* One of PASSIVE, FULL or RESTART */
  int (*xBusy)(void*),            /* Function to call when busy */
  void *pBusyArg,                 /* Context argument for xBusyHandler */
  int sync_flags,                 /* Flags for OsSync() (or 0) */
  u8 *zBuf                        /* Temporary buffer to use */
){
  int rc = SQLITE_OK;             /* Return code */
  int szPage;                     /* Database page-size */
  WalIterator *pIter = 0;         /* Wal iterator context */
  u32 iDbpage = 0;                /* Next database page to write */
  u32 iFrame = 0;                 /* Wal frame containing data for iDbpage */
  u32 mxSafeFrame;                /* Max frame that can be backfilled */
  u32 mxPage;                     /* Max database page to write */
  int i;                          /* Loop counter */
  volatile WalCkptInfo *pInfo;    /* The checkpoint status information */

  szPage = walPagesize(pWal);
  testcase( szPage<=32768 );
  testcase( szPage>=65536 );
  pInfo = walCkptInfo(pWal);
  if( pInfo->nBackfill<pWal->hdr.mxFrame ){

    /* EVIDENCE-OF: R-62920-47450 The busy-handler callback is never invoked
    ** in the SQLITE_CHECKPOINT_PASSIVE mode. */
    assert( eMode!=SQLITE_CHECKPOINT_PASSIVE || xBusy==0 );

    /* Compute in mxSafeFrame the index of the last frame of the WAL that is
    ** safe to write into the database.  Frames beyond mxSafeFrame might
    ** overwrite database pages that are in use by active readers and thus
    ** cannot be backfilled from the WAL.
    */
    mxSafeFrame = pWal->hdr.mxFrame;
    mxPage = pWal->hdr.nPage;
    for(i=1; i<WAL_NREADER; i++){
      /* Thread-sanitizer reports that the following is an unsafe read,
      ** as some other thread may be in the process of updating the value
      ** of the aReadMark[] slot. The assumption here is that if that is
      ** happening, the other client may only be increasing the value,
      ** not decreasing it. So assuming either that either the "old" or
      ** "new" version of the value is read, and not some arbitrary value
      ** that would never be written by a real client, things are still 
      ** safe.  */
      u32 y = pInfo->aReadMark[i];
      if( mxSafeFrame>y ){
        assert( y<=pWal->hdr.mxFrame );
        rc = walBusyLock(pWal, xBusy, pBusyArg, WAL_READ_LOCK(i), 1);
        if( rc==SQLITE_OK ){
          pInfo->aReadMark[i] = (i==1 ? mxSafeFrame : READMARK_NOT_USED);
          walUnlockExclusive(pWal, WAL_READ_LOCK(i), 1);
        }else if( rc==SQLITE_BUSY ){
          mxSafeFrame = y;
          xBusy = 0;
        }else{
          goto walcheckpoint_out;
        }
      }
    }

    /* Allocate the iterator */
    if( pInfo->nBackfill<mxSafeFrame ){
      rc = walIteratorInit(pWal, pInfo->nBackfill, &pIter);
      assert( rc==SQLITE_OK || pIter==0 );
    }

    if( pIter
     && (rc = walBusyLock(pWal, xBusy, pBusyArg, WAL_READ_LOCK(0),1))==SQLITE_OK
    ){
      u32 nBackfill = pInfo->nBackfill;

      pInfo->nBackfillAttempted = mxSafeFrame;

      /* Sync the WAL to disk */
      rc = sqlite3OsSync(pWal->pWalFd, CKPT_SYNC_FLAGS(sync_flags));

      /* If the database may grow as a result of this checkpoint, hint
      ** about the eventual size of the db file to the VFS layer.
      */
      if( rc==SQLITE_OK ){
        i64 nReq = ((i64)mxPage * szPage);
        i64 nSize;                    /* Current size of database file */
        rc = sqlite3OsFileSize(pWal->pDbFd, &nSize);
        if( rc==SQLITE_OK && nSize<nReq ){
          sqlite3OsFileControlHint(pWal->pDbFd, SQLITE_FCNTL_SIZE_HINT, &nReq);
        }
      }


      /* Iterate through the contents of the WAL, copying data to the db file */
      while( rc==SQLITE_OK && 0==walIteratorNext(pIter, &iDbpage, &iFrame) ){
        i64 iOffset;
        assert( walFramePgno(pWal, iFrame)==iDbpage );
        if( db->u1.isInterrupted ){
          rc = db->mallocFailed ? SQLITE_NOMEM_BKPT : SQLITE_INTERRUPT;
          break;
        }
        if( iFrame<=nBackfill || iFrame>mxSafeFrame || iDbpage>mxPage ){
          continue;
        }
        iOffset = walFrameOffset(iFrame, szPage) + WAL_FRAME_HDRSIZE;
        /* testcase( IS_BIG_INT(iOffset) ); // requires a 4GiB WAL file */
        rc = sqlite3OsRead(pWal->pWalFd, zBuf, szPage, iOffset);
        if( rc!=SQLITE_OK ) break;
        iOffset = (iDbpage-1)*(i64)szPage;
        testcase( IS_BIG_INT(iOffset) );
        rc = sqlite3OsWrite(pWal->pDbFd, zBuf, szPage, iOffset);
        if( rc!=SQLITE_OK ) break;
      }

      /* If work was actually accomplished... */
      if( rc==SQLITE_OK ){
        if( mxSafeFrame==walIndexHdr(pWal)->mxFrame ){
          i64 szDb = pWal->hdr.nPage*(i64)szPage;
          testcase( IS_BIG_INT(szDb) );
          rc = sqlite3OsTruncate(pWal->pDbFd, szDb);
          if( rc==SQLITE_OK ){
            rc = sqlite3OsSync(pWal->pDbFd, CKPT_SYNC_FLAGS(sync_flags));
          }
        }
        if( rc==SQLITE_OK ){
          pInfo->nBackfill = mxSafeFrame;
        }
      }

      /* Release the reader lock held while backfilling */
      walUnlockExclusive(pWal, WAL_READ_LOCK(0), 1);
    }

    if( rc==SQLITE_BUSY ){
      /* Reset the return code so as not to report a checkpoint failure
      ** just because there are active readers.  */
      rc = SQLITE_OK;
    }
  }

  /* If this is an SQLITE_CHECKPOINT_RESTART or TRUNCATE operation, and the
  ** entire wal file has been copied into the database file, then block 
  ** until all readers have finished using the wal file. This ensures that 
  ** the next process to write to the database restarts the wal file.
  */
  if( rc==SQLITE_OK && eMode!=SQLITE_CHECKPOINT_PASSIVE ){
    assert( pWal->writeLock );
    if( pInfo->nBackfill<pWal->hdr.mxFrame ){
      rc = SQLITE_BUSY;
    }else if( eMode>=SQLITE_CHECKPOINT_RESTART ){
      u32 salt1;
      sqlite3_randomness(4, &salt1);
      assert( pInfo->nBackfill==pWal->hdr.mxFrame );
      rc = walBusyLock(pWal, xBusy, pBusyArg, WAL_READ_LOCK(1), WAL_NREADER-1);
      if( rc==SQLITE_OK ){
        if( eMode==SQLITE_CHECKPOINT_TRUNCATE ){
          /* IMPLEMENTATION-OF: R-44699-57140 This mode works the same way as
          ** SQLITE_CHECKPOINT_RESTART with the addition that it also
          ** truncates the log file to zero bytes just prior to a
          ** successful return.
          **
          ** In theory, it might be safe to do this without updating the
          ** wal-index header in shared memory, as all subsequent reader or
          ** writer clients should see that the entire log file has been
          ** checkpointed and behave accordingly. This seems unsafe though,
          ** as it would leave the system in a state where the contents of
          ** the wal-index header do not match the contents of the 
          ** file-system. To avoid this, update the wal-index header to
          ** indicate that the log file contains zero valid frames.  */
          walRestartHdr(pWal, salt1);
          rc = sqlite3OsTruncate(pWal->pWalFd, 0);
        }
        walUnlockExclusive(pWal, WAL_READ_LOCK(1), WAL_NREADER-1);
      }
    }
  }

 walcheckpoint_out:
  walIteratorFree(pIter);
  return rc;
}